

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::io::Printer::ValidateIndexLookupInBounds(unsigned_long,unsigned_long,unsigned_long,google::protobuf::io::Printer::PrintOptions)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  anon_class_24_3_3e137c64 *o;
  VoidPtr ptr_local;
  
  std::
  invoke_abi_cxx11_<google::protobuf::io::Printer::ValidateIndexLookupInBounds(unsigned_long,unsigned_long,unsigned_long,google::protobuf::io::Printer::PrintOptions)::__1_const&>
            (__return_storage_ptr__,(anon_class_24_3_3e137c64 *)this);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}